

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O3

int __thiscall
merlin::graphical_model::order_score(graphical_model *this,graph *g,size_t v,OrderMethod kOType)

{
  double dVar1;
  pointer pmVar2;
  index j_00;
  _Rb_tree_node_base *p_Var3;
  pointer peVar4;
  pointer peVar5;
  _Rb_tree_node_base *p_Var6;
  edge_id *peVar7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  runtime_error *this_00;
  long lVar10;
  int iVar11;
  long lVar12;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_01;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> S;
  size_t j;
  undefined1 local_b8 [16];
  _Base_ptr local_a8;
  _Rb_tree_node_base *p_Stack_a0;
  _Rb_tree_node_base *local_98;
  pointer puStack_90;
  vsize *local_88;
  graphical_model *local_78;
  variable local_70;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  local_78 = this;
  switch(kOType.t_) {
  case MinFill:
    pmVar2 = (g->m_adj).
             super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var8 = (_Rb_tree_node_base *)(local_b8 + 8);
    local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
    iVar11 = 0;
    local_a8 = (_Base_ptr)0x0;
    puStack_90 = (pointer)0x0;
    peVar4 = *(pointer *)
              &pmVar2[v].super_my_vector<merlin::edge_id>.
               super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
    peVar5 = *(pointer *)
              ((long)&pmVar2[v].super_my_vector<merlin::edge_id>.
                      super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8);
    this_01 = (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)local_b8;
    p_Stack_a0 = p_Var8;
    local_98 = p_Var8;
    if (peVar4 != peVar5) {
      do {
        local_60._M_impl._0_8_ = peVar4->second;
        if (peVar4->first != local_60._M_impl._0_8_ && peVar4->first == v) {
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)local_b8,(unsigned_long *)&local_60);
          peVar5 = *(pointer *)
                    ((long)&pmVar2[v].super_my_vector<merlin::edge_id>.
                            super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8);
        }
        peVar4 = peVar4 + 1;
      } while (peVar4 != peVar5);
      this_01 = (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)local_b8;
      if (p_Stack_a0 != p_Var8) {
        iVar11 = 0;
        p_Var6 = p_Stack_a0;
        do {
          for (p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6); p_Var3 != p_Var8;
              p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
            peVar7 = graph::edge(g,*(index *)(p_Var6 + 1),*(index *)(p_Var3 + 1));
            iVar11 = iVar11 + (uint)(peVar7->second == DAT_001924d0 &&
                                    edge_id::NO_EDGE == peVar7->first);
          }
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
          this_01 = (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)local_b8;
        } while (p_Var6 != p_Var8);
      }
    }
    break;
  case WtMinFill:
    pmVar2 = (g->m_adj).
             super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    peVar4 = *(pointer *)
              &pmVar2[v].super_my_vector<merlin::edge_id>.
               super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
    peVar5 = *(pointer *)
              ((long)&pmVar2[v].super_my_vector<merlin::edge_id>.
                      super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8);
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (peVar4 == peVar5) {
      local_98 = (_Rb_tree_node_base *)0x0;
      puStack_90 = (pointer)0x0;
      local_a8 = (_Base_ptr)0x0;
      p_Stack_a0 = (_Rb_tree_node_base *)0x0;
      local_b8._0_8_ = (pointer)0x0;
      local_b8._8_8_ = (pointer)0x0;
      local_88 = (vsize *)0x0;
      lVar12 = 1;
    }
    else {
      do {
        local_b8._0_8_ = peVar4->second;
        if ((pointer)peVar4->first != (pointer)local_b8._0_8_ &&
            (pointer)peVar4->first == (pointer)v) {
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&local_60,(unsigned_long *)local_b8);
          peVar5 = *(pointer *)
                    ((long)&pmVar2[v].super_my_vector<merlin::edge_id>.
                            super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8);
        }
        peVar4 = peVar4 + 1;
      } while (peVar4 != peVar5);
      local_98 = (_Rb_tree_node_base *)0x0;
      puStack_90 = (pointer)0x0;
      local_a8 = (_Base_ptr)0x0;
      p_Stack_a0 = (_Rb_tree_node_base *)0x0;
      local_b8._0_8_ = (pointer)0x0;
      local_b8._8_8_ = (pointer)0x0;
      local_88 = (vsize *)0x0;
      lVar12 = 1;
      p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_60._M_impl.super__Rb_tree_header) {
        do {
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
          if ((_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header) {
            do {
              j_00 = *(index *)(p_Var6 + 1);
              peVar7 = graph::edge(g,*(index *)(p_Var8 + 1),j_00);
              if ((edge_id::NO_EDGE == peVar7->first) && (DAT_001924d0 == peVar7->second)) {
                dVar1 = (local_78->m_dims).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[j_00];
                local_70.m_states = (size_t)dVar1;
                local_70.m_states =
                     (long)(dVar1 - 9.223372036854776e+18) & (long)local_70.m_states >> 0x3f |
                     local_70.m_states;
                local_70.m_label = j_00;
                variable_set::operator|=((variable_set *)local_b8,&local_70);
              }
              p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
            } while ((_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header);
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != &local_60._M_impl.super__Rb_tree_header);
        if (local_b8._8_8_ - local_b8._0_8_ != 0) {
          lVar9 = (long)(local_b8._8_8_ - local_b8._0_8_) >> 3;
          lVar12 = 1;
          lVar10 = 0;
          do {
            lVar12 = lVar12 * local_88[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar9 + (ulong)(lVar9 == 0) != lVar10);
        }
      }
    }
    iVar11 = (int)lVar12 + (uint)(lVar12 == 0);
    variable_set::~variable_set((variable_set *)local_b8);
    this_01 = &local_60;
    break;
  case MinWidth:
    pmVar2 = (g->m_adj).
             super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar4 = *(pointer *)
              &pmVar2[v].super_my_vector<merlin::edge_id>.
               super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
    peVar5 = *(pointer *)
              ((long)&pmVar2[v].super_my_vector<merlin::edge_id>.
                      super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8);
    if (peVar4 == peVar5) {
      return 0;
    }
    iVar11 = 0;
    do {
      if (peVar4->first == v) {
        iVar11 = iVar11 + (uint)(peVar4->second != v);
      }
      peVar4 = peVar4 + 1;
    } while (peVar4 != peVar5);
    return iVar11;
  case WtMinWidth:
    pmVar2 = (g->m_adj).
             super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar4 = *(pointer *)
              &pmVar2[v].super_my_vector<merlin::edge_id>.
               super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
    peVar5 = *(pointer *)
              ((long)&pmVar2[v].super_my_vector<merlin::edge_id>.
                      super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8);
    if (peVar4 == peVar5) {
      return 0;
    }
    iVar11 = 0;
    do {
      if (peVar4->first != peVar4->second && peVar4->first == v) {
        dVar1 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[peVar4->second];
        lVar12 = (long)dVar1;
        iVar11 = iVar11 + ((uint)lVar12 |
                          (uint)(long)(dVar1 - 9.223372036854776e+18) & (uint)(lVar12 >> 0x3f));
      }
      peVar4 = peVar4 + 1;
    } while (peVar4 != peVar5);
    return iVar11;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown elimination ordering type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(this_01);
  return iVar11;
}

Assistant:

int order_score(const graph& g, size_t v, OrderMethod kOType) const {
		int s = 0.0;
		switch (kOType) {
		case OrderMethod::MinFill:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				std::set<size_t> S;
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						S.insert(j);
				}
				std::set<size_t>::iterator it1, it2;
				for (it1 = S.begin(); it1 != S.end(); ++it1) {
					it2 = it1;
					while (++it2 != S.end()) {
						size_t i = *it1, j = *it2;
						if (g.edge(i, j) == edge_id::NO_EDGE)
							++s;
					}
				}
				break;
			}
		case OrderMethod::WtMinFill:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				std::set<size_t> S;
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						S.insert(j);
				}
				variable_set vs;
				std::set<size_t>::iterator it1, it2;
				for (it1 = S.begin(); it1 != S.end(); ++it1) {
					it2 = it1;
					while (++it2 != S.end()) {
						size_t i = *it1, j = *it2;
						if (g.edge(i, j) == edge_id::NO_EDGE)
							vs |= var(j);
					}
				}
				s = vs.num_states();
				break;
			}
		case OrderMethod::MinWidth:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						++s;
				}
				break;
			}
		case OrderMethod::WtMinWidth:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						s += var(j).states();
				}
				break;
			}
		default:
			throw std::runtime_error("Unknown elimination ordering type");
			break;
		}
		return s;
	}